

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O2

pair<double,_double> __thiscall
PyVLEIsolineTracer<double>::get_integration_limits(PyVLEIsolineTracer<double> *this)

{
  make_caster<std::pair<double,_double>_> mVar1;
  pair<double,_double> pVar2;
  pair<double,_double> pVar3;
  function overload;
  object o;
  gil_scoped_acquire gil;
  gil_scoped_acquire acquire;
  gil_scoped_release release;
  object local_60;
  handle local_58;
  double local_50;
  double local_48;
  gil_scoped_acquire local_40;
  gil_scoped_acquire local_30;
  gil_scoped_release local_20;
  
  pybind11::gil_scoped_release::gil_scoped_release(&local_20,false);
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_30);
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_40);
  pybind11::get_overload<VLEIsolineTracer<double>>
            ((pybind11 *)&local_60,&this->super_VLEIsolineTracer<double>,"get_integration_limits");
  if (local_60.super_handle.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_58);
    mVar1 = pybind11::detail::load_type<std::pair<double,double>>(&local_58);
    local_50 = mVar1.super_tuple_caster<std::pair,_double,_double>.subcasters.second.value;
    local_48 = mVar1.super_tuple_caster<std::pair,_double,_double>.subcasters.first.value;
    pybind11::object::~object((object *)&local_58);
  }
  pybind11::object::~object(&local_60);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_40);
  pVar2.second = local_50;
  pVar2.first = local_48;
  if (local_60.super_handle.m_ptr == (PyObject *)0x0) {
    pVar2 = AbstractIsolineTracer<double>::get_integration_limits
                      ((AbstractIsolineTracer<double> *)this);
  }
  local_50 = pVar2.second;
  local_48 = pVar2.first;
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_30);
  pybind11::gil_scoped_release::~gil_scoped_release(&local_20);
  pVar3.second = local_50;
  pVar3.first = local_48;
  return pVar3;
}

Assistant:

std::pair<TYPE, TYPE> get_integration_limits() override {
        // Release the GIL
        py::gil_scoped_release release;
        {
            // Acquire GIL before calling Python code
            py::gil_scoped_acquire acquire;

            // Parameters to macro are: Return type, parent class, name of function in C++, argument(s)
            typedef std::pair<TYPE, TYPE> pairdoubledouble;
            PYBIND11_OVERLOAD(pairdoubledouble, 
                              VLEIsolineTracer, 
                              get_integration_limits, 
                              // No arguments
                              );
        }
    }